

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::doWalkFunction(OptimizeInstructions *this,Function *func)

{
  PassRunner *pPVar1;
  Expression **ppEVar2;
  pointer pTVar3;
  undefined1 auStack_168 [8];
  LocalScanner scanner;
  pointer local_78;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_60;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  scanner.localInfo = (vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_> *)&pPVar1->options;
  this->fastMath = (pPVar1->options).fastMath;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currModule =
       (Module *)&this->localInfo;
  auStack_168 = (undefined1  [8])0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed._M_elems[9]
  .currp = (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currFunction =
       (Function *)
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  LocalScanner::doWalkFunction((LocalScanner *)auStack_168,func);
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
      super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed.
      _M_elems[9].currp != (Expression **)0x0) {
    operator_delete(scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack
                    .fixed._M_elems[9].currp,
                    (long)scanner.
                          super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .
                          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .
                          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  ppEVar2 = &func->body;
  Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::walk
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
              ).
              super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
              .
              super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             ,ppEVar2);
  if (this->refinalize == true) {
    ReFinalize::ReFinalize((ReFinalize *)auStack_168);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               &scanner.
                super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                fixed._M_elems[1].currp,ppEVar2);
    auStack_168 = (undefined1  [8])&PTR__ReFinalize_00d870a0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_60);
    if (scanner.localInfo != (vector<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_> *)0x0) {
      operator_delete(scanner.localInfo,(long)local_78 - (long)scanner.localInfo);
    }
    auStack_168 = (undefined1  [8])&PTR__Pass_00d87048;
    if ((Expression ***)
        scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
        super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.usedFixed
        != &scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed.
            _M_elems[0].currp) {
      operator_delete((void *)scanner.
                              super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                              .
                              super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                              .stack.usedFixed,
                      (long)scanner.
                            super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            .
                            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                            .stack.fixed._M_elems[0].currp + 1);
    }
  }
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currModule =
       (Module *)
       &((this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).super_Pass.runner)->options;
  auStack_168 = (undefined1  [8])0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep =
       (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed._M_elems[9]
  .currp = (Expression **)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.currFunction =
       (Function *)0x0;
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
              *)auStack_168,
             PostWalker<wasm::(anonymous_namespace)::FinalOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FinalOptimizer,_void>_>
             ::scan,ppEVar2);
  if (((long)scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
             super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
             flexible.
             super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
             super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed.
             _M_elems[9].currp >> 4) +
      (long)scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep != 0
     ) {
    do {
      if ((pointer)scanner.
                   super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                   super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                   fixed._M_elems[9].currp ==
          scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                        ,0x5a,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::Task, N = 10]"
                       );
        }
        pTVar3 = (pointer)&scanner.
                           super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                           .
                           super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                           .stack.fixed._M_elems
                           [(long)scanner.
                                  super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                                  .
                                  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                                  .replacep + -2].currp;
      }
      else {
        pTVar3 = scanner.
                 super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                 super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                 flexible.
                 super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                 ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      ppEVar2 = pTVar3->currp;
      if ((pointer)scanner.
                   super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                   super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
                   fixed._M_elems[9].currp ==
          scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if (scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
            super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep ==
            (Expression **)0x0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                        ,0x51,
                        "void wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::Task, 10>::pop_back() [T = wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::Task, N = 10]"
                       );
        }
        scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
        super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.replacep =
             (Expression **)
             ((long)scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    replacep + -1);
      }
      else {
        scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
        super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start =
             scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
             super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.
             flexible.
             super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
      }
      auStack_168 = (undefined1  [8])ppEVar2;
      if (*ppEVar2 == (Expression *)0x0) {
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-traversal.h"
                      ,0x139,
                      "void wasm::Walker<wasm::(anonymous namespace)::FinalOptimizer, wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::FinalOptimizer, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::FinalOptimizer>]"
                     );
      }
      (*pTVar3->func)((LocalScanner *)auStack_168,ppEVar2);
    } while (((long)scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack
                    .flexible.
                    super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack
                    .fixed._M_elems[9].currp >> 4) +
             (long)scanner.
                   super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                   super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                   replacep != 0);
  }
  scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
  super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (scanner.super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
      super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack.fixed.
      _M_elems[9].currp != (Expression **)0x0) {
    operator_delete(scanner.
                    super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.
                    super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>.stack
                    .fixed._M_elems[9].currp,
                    (long)scanner.
                          super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .
                          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)scanner.
                          super_PostWalker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .
                          super_Walker<wasm::LocalScanner,_wasm::Visitor<wasm::LocalScanner,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  EHUtils::handleBlockNestedPops
            (func,(this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currModule);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    fastMath = getPassOptions().fastMath;

    // First, scan locals.
    {
      LocalScanner scanner(localInfo, getPassOptions());
      scanner.setModule(getModule());
      scanner.walkFunction(func);
    }

    // Main walk.
    super::doWalkFunction(func);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, getModule());
    }

    // Final optimizations.
    {
      FinalOptimizer optimizer(getPassOptions());
      optimizer.walkFunction(func);
    }

    // Some patterns create blocks that can interfere 'catch' and 'pop', nesting
    // the 'pop' into a block making it invalid.
    EHUtils::handleBlockNestedPops(func, *getModule());
  }